

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createExpressions.cpp
# Opt level: O0

Expr * toUnsigned(Expr *expr,Program *program)

{
  Expr *pEVar1;
  IntegerType *in_RSI;
  TypeHandler *in_RDI;
  IntegerType **unaff_retaddr;
  Expr **in_stack_00000008;
  Program *in_stack_00000010;
  Expr *cast;
  IntegerType *IT;
  
  (*(code *)(in_RDI->program->typeHandler).typeCache._M_h._M_buckets)();
  TypeHandler::setUnsigned(in_RDI,in_RSI);
  pEVar1 = Program::makeExpr<CastExpr,Expr*&,IntegerType*>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return pEVar1;
}

Assistant:

static Expr *toUnsigned(Expr *expr, Program& program) {
    auto IT = static_cast<IntegerType*>(expr->getType());
    auto *cast
        = program.makeExpr<CastExpr>(
            expr,
            program.typeHandler.setUnsigned(IT)
    );
    return cast;
}